

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb)

{
  cmFunctionBlocker *local_68;
  cmListFileContext local_60;
  
  local_68 = fb;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    GetExecutionContext(&local_60,this);
    cmListFileContext::operator=(&fb->StartingContext,&local_60);
    cmListFileContext::~cmListFileContext(&local_60);
  }
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::push_back
            (&this->FunctionBlockers,&local_68);
  return;
}

Assistant:

void cmMakefile::AddFunctionBlocker(cmFunctionBlocker* fb)
{
  if(!this->CallStack.empty())
    {
    // Record the context in which the blocker is created.
    fb->SetStartingContext(this->GetExecutionContext());
    }

  this->FunctionBlockers.push_back(fb);
}